

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

size_t __thiscall ON_RTreeMemPool::SizeOfUnusedBuffer(ON_RTreeMemPool *this)

{
  size_t local_20;
  size_t sz;
  Blk *blk;
  ON_RTreeMemPool *this_local;
  
  local_20 = this->m_buffer_capacity;
  for (sz = (size_t)this->m_nodes; sz != 0; sz = *(size_t *)sz) {
    local_20 = local_20 + 0x158;
  }
  for (sz = (size_t)this->m_list_nodes; sz != 0; sz = *(size_t *)sz) {
    local_20 = local_20 + 0x10;
  }
  return local_20;
}

Assistant:

size_t ON_RTreeMemPool::SizeOfUnusedBuffer() const
{
  const struct Blk* blk;
  size_t sz = m_buffer_capacity;
  for ( blk = m_nodes; blk; blk = blk->m_next )
  {
    sz += sizeof(struct ON_RTreeNode);
  }
  for ( blk = m_list_nodes; blk; blk = blk->m_next )
  {
    sz += sizeof(struct ON_RTreeListNode);
  }
  return sz;
}